

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RollupOutput::PrettyPrintRow
          (RollupOutput *this,RollupRow *row,size_t indent,OutputOptions *options,ostream *out)

{
  ostream *poVar1;
  undefined1 force_sign;
  bool diff_mode;
  undefined1 extraout_DL;
  undefined1 diff_mode_00;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  force_sign = SUB81(options,0);
  if (&this->toplevel_row_ != row) {
    if ((options->show == kShowVM) && ((row->size).vm == 0)) {
      return;
    }
    if ((options->show == kShowFile) && ((row->size).file == 0)) {
      return;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,anon_var_dwarf_37602c + 0x11,&local_69);
  anon_unknown_34::FixedWidthString(&local_48,&local_68,indent);
  poVar1 = std::operator<<(out,(string *)&local_48);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  diff_mode_00 = diff_mode;
  if (options->show != kShowVM) {
    (anonymous_namespace)::PercentString_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)(ulong)this->diff_mode_,row->filepercent,diff_mode
              );
    poVar1 = std::operator<<(out,(string *)&local_48);
    poVar1 = std::operator<<(poVar1," ");
    (anonymous_namespace)::SiPrint_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)(row->size).file,(ulong)this->diff_mode_,
               (bool)force_sign);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    std::operator<<(poVar1," ");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    diff_mode_00 = extraout_DL;
    if (options->show == kShowFile) goto LAB_0017ab79;
  }
  (anonymous_namespace)::PercentString_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)(ulong)this->diff_mode_,row->vmpercent,
             (bool)diff_mode_00);
  poVar1 = std::operator<<(out,(string *)&local_48);
  poVar1 = std::operator<<(poVar1," ");
  (anonymous_namespace)::SiPrint_abi_cxx11_
            (&local_68,(_anonymous_namespace_ *)(row->size).vm,(ulong)this->diff_mode_,
             (bool)force_sign);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
LAB_0017ab79:
  poVar1 = std::operator<<(out,"   ");
  poVar1 = std::operator<<(poVar1,(string *)row);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void RollupOutput::PrettyPrintRow(const RollupRow& row, size_t indent,
                                  const OutputOptions& options,
                                  std::ostream* out) const {
  if (&row != &toplevel_row_) {
    // Avoid printing this row if it is only zero.
    // This can happen when using --domain if the row is zero for this domain.
    if ((!ShowFile(options) && row.size.vm == 0) ||
        (!ShowVM(options) && row.size.file == 0)) {
      return;
    }
  }

  *out << FixedWidthString("", indent) << " ";

  if (ShowFile(options)) {
    *out << PercentString(row.filepercent, diff_mode_) << " "
         << SiPrint(row.size.file, diff_mode_) << " ";
  }

  if (ShowVM(options)) {
    *out << PercentString(row.vmpercent, diff_mode_) << " "
         << SiPrint(row.size.vm, diff_mode_) << " ";
  }

  *out << "   " << row.name << "\n";
}